

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O2

REF_STATUS ref_cavity_verify_face_manifold(REF_CAVITY ref_cavity)

{
  int node1;
  undefined8 uVar1;
  char *pcVar2;
  long lVar3;
  long lVar4;
  REF_INT found_face;
  
  if (ref_cavity->state != REF_CAVITY_INCONSISTENT) {
    lVar3 = 0;
    for (lVar4 = 0; lVar4 < ref_cavity->maxface; lVar4 = lVar4 + 1) {
      node1 = *(int *)((long)ref_cavity->f2n + lVar3);
      if (node1 != -1) {
        ref_cavity_find_face_with_side
                  (ref_cavity,*(REF_INT *)((long)ref_cavity->f2n + lVar3 + 4),node1,&found_face);
        if (ref_cavity->state == REF_CAVITY_INCONSISTENT) {
          return 0;
        }
        if (found_face == -1) {
          pcVar2 = "side 01 missing";
          uVar1 = 0x1dc;
LAB_00193837:
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 uVar1,"ref_cavity_verify_face_manifold",pcVar2);
          return 1;
        }
        ref_cavity_find_face_with_side
                  (ref_cavity,*(REF_INT *)((long)ref_cavity->f2n + lVar3 + 8),
                   *(REF_INT *)((long)ref_cavity->f2n + lVar3 + 4),&found_face);
        if (ref_cavity->state == REF_CAVITY_INCONSISTENT) {
          return 0;
        }
        if (found_face == -1) {
          pcVar2 = "side 12 missing";
          uVar1 = 0x1e3;
          goto LAB_00193837;
        }
        ref_cavity_find_face_with_side
                  (ref_cavity,*(REF_INT *)((long)ref_cavity->f2n + lVar3),
                   *(REF_INT *)((long)ref_cavity->f2n + lVar3 + 8),&found_face);
        if (ref_cavity->state == REF_CAVITY_INCONSISTENT) {
          return 0;
        }
        if (found_face == -1) {
          pcVar2 = "side 20 missing";
          uVar1 = 0x1ea;
          goto LAB_00193837;
        }
      }
      lVar3 = lVar3 + 0xc;
    }
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_cavity_verify_face_manifold(
    REF_CAVITY ref_cavity) {
  REF_INT face, found_face;

  if (REF_CAVITY_INCONSISTENT == ref_cavity_state(ref_cavity))
    return REF_SUCCESS;

  each_ref_cavity_valid_face(ref_cavity, face) {
    RSS(ref_cavity_find_face_with_side(
            ref_cavity, ref_cavity_f2n(ref_cavity, 1, face),
            ref_cavity_f2n(ref_cavity, 0, face), &found_face),
        "find side 01");
    if (REF_CAVITY_INCONSISTENT == ref_cavity_state(ref_cavity))
      return REF_SUCCESS;
    RUS(REF_EMPTY, found_face, "side 01 missing");
    RSS(ref_cavity_find_face_with_side(
            ref_cavity, ref_cavity_f2n(ref_cavity, 2, face),
            ref_cavity_f2n(ref_cavity, 1, face), &found_face),
        "find side 12");
    if (REF_CAVITY_INCONSISTENT == ref_cavity_state(ref_cavity))
      return REF_SUCCESS;
    RUS(REF_EMPTY, found_face, "side 12 missing");
    RSS(ref_cavity_find_face_with_side(
            ref_cavity, ref_cavity_f2n(ref_cavity, 0, face),
            ref_cavity_f2n(ref_cavity, 2, face), &found_face),
        "find side 20");
    if (REF_CAVITY_INCONSISTENT == ref_cavity_state(ref_cavity))
      return REF_SUCCESS;
    RUS(REF_EMPTY, found_face, "side 20 missing");
  }

  return REF_SUCCESS;
}